

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logs3.c
# Opt level: O0

void logs3_report(logmath_t *logmath)

{
  uint32 local_1c;
  uint local_18;
  uint32 shift;
  uint32 width;
  uint32 size;
  logmath_t *logmath_local;
  
  if (logmath != (logmath_t *)0x0) {
    _width = logmath;
    logmath_get_table_shape(logmath,&shift,&local_18,&local_1c);
    err_msg(ERR_INFO,(char *)0x0,0,"Initialization of the log add table\n");
    err_msg(ERR_INFO,(char *)0x0,0,"Log-Add table size = %d x %d >> %d\n",(ulong)shift,
            (ulong)local_18,local_1c);
    err_msg(ERR_INFO,(char *)0x0,0,"\n");
  }
  return;
}

Assistant:

void
logs3_report(logmath_t* logmath)
{
    if (logmath) {
	uint32 size, width, shift;

	logmath_get_table_shape(logmath, &size, &width, &shift);
	E_INFO_NOFN("Initialization of the log add table\n");
	E_INFO_NOFN("Log-Add table size = %d x %d >> %d\n", size, width, shift);
	E_INFO_NOFN("\n");
    }
}